

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O1

void mxx::impl::allgatherv_big<int>
               (int *data,size_t size,int *out,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,comm *comm)

{
  MPI_Comm poVar1;
  MPI_Datatype poVar2;
  MPI_Request *ppoVar3;
  ulong uVar4;
  long lVar5;
  datatype dt;
  requests reqs;
  datatype dt_2;
  datatype senddt;
  datatype local_b0;
  requests local_98;
  int *local_78;
  int *local_70;
  size_t local_68;
  datatype local_60;
  datatype local_48;
  
  local_98._vptr_requests = (_func_int **)&PTR__requests_001a5d90;
  local_98.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78 = out;
  local_70 = data;
  local_68 = size;
  if (0 < comm->m_size) {
    uVar4 = 0;
    lVar5 = 0;
    do {
      local_b0._vptr_datatype = (_func_int **)&PTR__datatype_001a5d60;
      local_b0.mpitype = (MPI_Datatype)&ompi_mpi_int;
      local_b0.builtin = true;
      datatype::contiguous(&local_48,&local_b0,local_68);
      datatype::~datatype(&local_b0);
      poVar2 = local_48.mpitype;
      poVar1 = comm->mpi_comm;
      ppoVar3 = requests::add(&local_98);
      MPI_Isend(local_70,1,poVar2,uVar4 & 0xffffffff,0x4d2,poVar1,ppoVar3);
      local_60._vptr_datatype = (_func_int **)&PTR__datatype_001a5d60;
      local_60.mpitype = (MPI_Datatype)&ompi_mpi_int;
      local_60.builtin = true;
      datatype::contiguous
                (&local_b0,&local_60,
                 (recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar4]);
      datatype::~datatype(&local_60);
      poVar2 = local_b0.mpitype;
      poVar1 = comm->mpi_comm;
      ppoVar3 = requests::add(&local_98);
      MPI_Irecv(local_78 + lVar5,1,poVar2,uVar4 & 0xffffffff,0x4d2,poVar1,ppoVar3);
      lVar5 = lVar5 + (recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar4];
      datatype::~datatype(&local_b0);
      datatype::~datatype(&local_48);
      uVar4 = uVar4 + 1;
    } while ((long)uVar4 < (long)comm->m_size);
  }
  MPI_Waitall((ulong)((long)local_98.m_requests.
                            super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_98.m_requests.
                           super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 3,
              local_98.m_requests.
              super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
              super__Vector_impl_data._M_start,0);
  requests::~requests(&local_98);
  return;
}

Assistant:

void allgatherv_big(const T* data, size_t size, T* out, const std::vector<size_t>& recv_sizes, const mxx::comm& comm = mxx::comm()) {
    // implementation of scatter for messages sizes that exceed MAX_INT
    mxx::requests reqs;
    int tag = 1234; // TODO: handle tags somewhere (as attributes in the comm?)
    size_t offset = 0;
    for (int i = 0; i < comm.size(); ++i) {
        // send to this rank
        mxx::datatype senddt = mxx::get_datatype<T>().contiguous(size);
        MPI_Isend(const_cast<T*>(data), 1, senddt.type(), i, tag, comm, &reqs.add());
        // receive from this rank
        mxx::datatype dt = mxx::get_datatype<T>().contiguous(recv_sizes[i]);
        MPI_Irecv(const_cast<T*>(out)+offset, 1, dt.type(), i, tag, comm, &reqs.add());
        offset += recv_sizes[i];
    }
    reqs.wait();
}